

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kinematics.cc
# Opt level: O2

bool RigidBodyDynamics::InverseKinematics
               (Model *model,VectorNd *Qinit,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *body_id,
               vector<Vector3_t,_std::allocator<Vector3_t>_> *body_point,
               vector<Vector3_t,_std::allocator<Vector3_t>_> *target_pos,VectorNd *Qres,
               double step_tol,double lambda,uint max_iter)

{
  pointer pVVar1;
  vector<Vector3_t,_std::allocator<Vector3_t>_> *pvVar2;
  Matrix<double,__1,_1,_0,__1,_1> *Q;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  double *pdVar9;
  double *pdVar10;
  ulong uVar11;
  bool bVar12;
  RealScalar RVar13;
  MatrixNd JJTe_lambda2_I;
  VectorNd e;
  VectorNd test_delta;
  VectorNd test_res;
  VectorNd test_1;
  VectorNd delta_theta;
  MatrixNd J;
  Matrix<double,__1,_1,_0,__1,_1> local_180;
  double local_170;
  uint local_164;
  DenseStorage<double,__1,__1,__1,_0> local_160;
  DenseStorage<double,__1,__1,_1,_0> local_148;
  double local_138;
  ulong local_130;
  vector<Vector3_t,_std::allocator<Vector3_t>_> *local_128;
  Matrix<double,__1,_1,_0,__1,_1> *local_120;
  ulong local_118;
  double *local_110 [2];
  Matrix<double,__1,_1,_0,__1,_1> local_100;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_f0;
  Index local_d8;
  Index local_d0;
  double local_c8;
  Index local_c0;
  Index local_b8;
  vector<Vector3_t,_std::allocator<Vector3_t>_> *local_98;
  void *local_90 [2];
  Matrix<double,__1,_1,_0,__1,_1> local_80;
  Matrix<double,__1,_1,_0,__1,_1> *local_68;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  *local_60;
  DenseStorage<double,__1,__1,_1,_0> local_58;
  DenseStorage<double,__1,__1,__1,_0> local_48;
  
  local_f0.m_lhs =
       (LhsNested)
       (((long)(body_id->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(body_id->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start >> 2) * 3);
  local_f0.m_rhs = (RhsNested)(ulong)model->qdot_size;
  local_f0._16_8_ = 0;
  local_170 = lambda;
  local_138 = step_tol;
  local_98 = target_pos;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_80,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_f0);
  local_f0.m_lhs =
       (LhsNested)
       (((long)(body_id->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(body_id->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start >> 2) * 3);
  local_f0._16_8_ = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_148,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_f0);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>(Qres,Qinit);
  local_170 = local_170 * local_170;
  local_130 = 0;
  local_128 = body_point;
  local_120 = Qres;
  do {
    if ((uint)local_130 == max_iter) {
LAB_0024a184:
      uVar5 = (uint)local_130;
      free(local_148.m_data);
      free(local_80.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data)
      ;
      return uVar5 < max_iter;
    }
    UpdateKinematicsCustom(model,Qres,(VectorNd *)0x0,(VectorNd *)0x0);
    uVar5 = 0;
    uVar4 = 0;
    while( true ) {
      pvVar2 = local_128;
      if ((ulong)((long)(body_id->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(body_id->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_start >> 2) <= (ulong)uVar4) break;
      local_160.m_rows = (Index)model->qdot_size;
      local_160.m_data = (double *)0x3;
      local_160.m_cols = 0;
      local_164 = uVar5;
      local_118 = (ulong)uVar4;
      Eigen::Matrix<double,-1,-1,0,-1,-1>::
      Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                ((Matrix<double,_1,_1,0,_1,_1> *)&local_f0,
                 (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                  *)&local_160);
      uVar11 = local_118;
      Q = local_120;
      CalcPointJacobian(model,local_120,
                        (body_id->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_start[local_118],
                        (pvVar2->super__Vector_base<Vector3_t,_std::allocator<Vector3_t>_>)._M_impl.
                        super__Vector_impl_data._M_start + local_118,(MatrixNd *)&local_f0,false);
      CalcBodyToBaseCoordinates
                ((Vector3d *)&local_160,model,Q,
                 (body_id->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar11],
                 (pvVar2->super__Vector_base<Vector3_t,_std::allocator<Vector3_t>_>)._M_impl.
                 super__Vector_impl_data._M_start + uVar11,false);
      uVar5 = local_164;
      uVar4 = model->qdot_size;
      pVVar1 = (local_98->super__Vector_base<Vector3_t,_std::allocator<Vector3_t>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar7 = 0;
      uVar6 = local_164;
      for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
        pdVar10 = (double *)
                  ((long)&((local_f0.m_lhs)->
                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                          m_data + lVar7);
        pdVar9 = local_80.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data + uVar6;
        uVar3 = (ulong)uVar4;
        while (bVar12 = uVar3 != 0, uVar3 = uVar3 - 1, bVar12) {
          *pdVar9 = *pdVar10;
          pdVar10 = pdVar10 + (long)local_f0.m_rhs;
          pdVar9 = pdVar9 + local_80.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_rows;
        }
        local_148.m_data[(uint)((int)uVar11 * 3 + (int)lVar8)] =
             *(double *)
              ((long)&pVVar1[uVar11].super_Vector3d.
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage +
              lVar8 * 8) - (double)(&local_160.m_data)[lVar8];
        lVar7 = lVar7 + 8;
        uVar6 = uVar6 + 1;
      }
      free(local_f0.m_lhs);
      uVar4 = (int)local_118 + 1;
      uVar5 = uVar5 + 3;
      Qres = local_120;
    }
    RVar13 = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::norm
                       ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_148);
    if (RVar13 < local_138) goto LAB_0024a184;
    local_d8 = local_148.m_rows;
    local_d0 = local_148.m_rows;
    local_c8 = local_170;
    local_c0 = local_148.m_rows;
    local_b8 = local_148.m_rows;
    local_f0.m_lhs = &local_80;
    local_f0.m_rhs = &local_80;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_160,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
                *)&local_f0);
    local_f0.m_lhs =
         (LhsNested)
         (((long)(body_id->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(body_id->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 2) * 3);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<unsigned_long>
              (&local_180,(unsigned_long *)&local_f0);
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(&local_48,&local_160);
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_58,&local_148);
    Math::LinSolveGaussElimPivot((MatrixNd *)&local_48,(VectorNd *)&local_58,&local_180);
    free(local_58.m_data);
    free(local_48.m_data);
    local_f0.m_lhs = &local_80;
    local_f0.m_rhs = &local_180;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_90,
               (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                *)&local_f0);
    local_f0.m_lhs = Qres;
    local_f0.m_rhs = (RhsNested)local_90;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
              (Qres,&local_f0);
    RVar13 = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::norm
                       ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_90);
    if (RVar13 < local_138) {
      free(local_90[0]);
      free(local_180.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
          );
      free(local_160.m_data);
      goto LAB_0024a184;
    }
    local_100.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)
         local_180.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<long>
              ((Matrix<double,__1,_1,_0,__1,_1> *)&local_f0,(long *)&local_100);
    local_110[0] = (double *)
                   local_180.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_rows;
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<long>(&local_100,(long *)local_110);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_f0);
    for (uVar5 = 0; uVar11 = (ulong)uVar5,
        (long)uVar11 <
        local_180.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
        uVar5 = uVar5 + 1) {
      (&((local_f0.m_lhs)->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
        .m_data)[uVar11] = (double *)0x3ff0000000000000;
      local_68 = &local_80;
      local_60 = &local_f0;
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_110,
                 (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                  *)&local_68);
      RVar13 = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::squaredNorm
                         ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_110);
      local_100.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
      [uVar11] = RVar13;
      (&((local_f0.m_lhs)->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
        .m_data)[uVar11] = (double *)0x0;
      free(local_110[0]);
    }
    free(local_100.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    free(local_f0.m_lhs);
    free(local_90[0]);
    free(local_180.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    free(local_160.m_data);
    local_130 = (ulong)((int)local_130 + 1);
  } while( true );
}

Assistant:

RBDL_DLLAPI bool InverseKinematics (
    Model &model,
    const VectorNd &Qinit,
    const std::vector<unsigned int>& body_id,
    const std::vector<Vector3d>& body_point,
    const std::vector<Vector3d>& target_pos,
    VectorNd &Qres,
    double step_tol,
    double lambda,
    unsigned int max_iter) {
  assert (Qinit.size() == model.q_size);
  assert (body_id.size() == body_point.size());
  assert (body_id.size() == target_pos.size());

  MatrixNd J = MatrixNd::Zero(3 * body_id.size(), model.qdot_size);
  VectorNd e = VectorNd::Zero(3 * body_id.size());

  Qres = Qinit;

  for (unsigned int ik_iter = 0; ik_iter < max_iter; ik_iter++) {
    UpdateKinematicsCustom (model, &Qres, NULL, NULL);

    for (unsigned int k = 0; k < body_id.size(); k++) {
      MatrixNd G (MatrixNd::Zero(3, model.qdot_size));
      CalcPointJacobian (model, Qres, body_id[k], body_point[k], G, false);
      Vector3d point_base = 
        CalcBodyToBaseCoordinates (model, Qres, body_id[k], body_point[k], false);
      LOG << "current_pos = " << point_base.transpose() << std::endl;

      for (unsigned int i = 0; i < 3; i++) {
        for (unsigned int j = 0; j < model.qdot_size; j++) {
          unsigned int row = k * 3 + i;
          LOG << "i = " << i << " j = " << j << " k = " << k << " row = " 
            << row << " col = " << j << std::endl;
          J(row, j) = G (i,j);
        }

        e[k * 3 + i] = target_pos[k][i] - point_base[i];
      }
    }

    LOG << "J = " << J << std::endl;
    LOG << "e = " << e.transpose() << std::endl;

    // abort if we are getting "close"
    if (e.norm() < step_tol) {
      LOG << "Reached target close enough after " << ik_iter << " steps" << std::endl;
      return true;
    }

    MatrixNd JJTe_lambda2_I = 
      J * J.transpose() 
      + lambda*lambda * MatrixNd::Identity(e.size(), e.size());

    VectorNd z (body_id.size() * 3);

    bool solve_successful = LinSolveGaussElimPivot (JJTe_lambda2_I, e, z);
    assert (solve_successful);

    LOG << "z = " << z << std::endl;

    VectorNd delta_theta = J.transpose() * z;
    LOG << "change = " << delta_theta << std::endl;

    Qres = Qres + delta_theta;
    LOG << "Qres = " << Qres.transpose() << std::endl;

    if (delta_theta.norm() < step_tol) {
      LOG << "reached convergence after " << ik_iter << " steps" << std::endl;
      return true;
    }

    VectorNd test_1 (z.size());
    VectorNd test_res (z.size());

    test_1.setZero();

    for (unsigned int i = 0; i < z.size(); i++) {
      test_1[i] = 1.;

      VectorNd test_delta = J.transpose() * test_1;

      test_res[i] = test_delta.squaredNorm();

      test_1[i] = 0.;
    }

    LOG << "test_res = " << test_res.transpose() << std::endl;
  }

  return false;
}